

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_ary.c
# Opt level: O0

adt_ary_t * adt_ary_make(void **ppElem,int32_t s32Len,_func_void_void_ptr *pDestructor)

{
  void **local_48;
  void **ppSrc;
  void **ppDest;
  int32_t s32i;
  adt_ary_t *self;
  _func_void_void_ptr *pDestructor_local;
  int32_t s32Len_local;
  void **ppElem_local;
  
  if (s32Len < 0x7fffffff) {
    if (ppElem == (void **)0x0) {
      ppElem_local = (void **)0x0;
    }
    else {
      ppElem_local = &adt_ary_new(pDestructor)->ppAlloc;
      if ((adt_ary_t *)ppElem_local == (adt_ary_t *)0x0) {
        ppElem_local = (void **)0x0;
      }
      else {
        adt_ary_extend((adt_ary_t *)ppElem_local,s32Len);
        if (((adt_ary_t *)ppElem_local)->pFirst == (void **)0x0) {
          __assert_fail("ppDest != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/adt/src/adt_ary.c"
                        ,0x3c,"adt_ary_t *adt_ary_make(void **, int32_t, void (*)(void *))");
        }
        local_48 = ppElem;
        ppSrc = ((adt_ary_t *)ppElem_local)->pFirst;
        for (ppDest._4_4_ = 0; ppDest._4_4_ < s32Len; ppDest._4_4_ = ppDest._4_4_ + 1) {
          *ppSrc = *local_48;
          local_48 = local_48 + 1;
          ppSrc = ppSrc + 1;
        }
      }
    }
  }
  else {
    ppElem_local = (void **)0x0;
  }
  return (adt_ary_t *)ppElem_local;
}

Assistant:

adt_ary_t*	adt_ary_make(void** ppElem, int32_t s32Len,void (*pDestructor)(void*)){
	adt_ary_t *self;
	int32_t s32i;
	void **ppDest,**ppSrc;

	if(s32Len>= INT32_MAX){
		//array length too long
		return (adt_ary_t*) 0;
	}

	if(ppElem == 0){
		return (adt_ary_t*) 0;
	}

	self = adt_ary_new(pDestructor);
	if(self==(adt_ary_t*)0){
		return (adt_ary_t*)0;
	}
	adt_ary_extend(self,s32Len);
	ppDest=self->pFirst;
	assert(ppDest != 0);
	ppSrc=ppElem;
	for(s32i=0;s32i<s32Len;s32i++){
		*(ppDest++) = *(ppSrc++);
	}
	return self;
}